

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRHeadTrackingNode::render
          (VRHeadTrackingNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  
  VRDataIndex::pushState(renderState);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"HeadMatrix",&local_81);
  VRDataIndex::addData
            (&local_40,renderState,&local_80,&(this->_headMatrix).super_VRFloatArrayConvertible);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"CameraMatrix",&local_81);
  VRDataIndex::addData
            (&local_60,renderState,&local_80,&(this->_headMatrix).super_VRFloatArrayConvertible);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  VRDisplayNode::render(&this->super_VRDisplayNode,renderState,renderHandler);
  VRDataIndex::popState(renderState);
  return;
}

Assistant:

void
VRHeadTrackingNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler)
{
	renderState->pushState();

	renderState->addData("HeadMatrix", _headMatrix);

  // We copy the head matrix into "CameraMatrix" in case this is only a mono
  // configuration and the two are the same thing.  We don't use a link because
  // a stereo configuration will overwrite the camera matrix.
	renderState->addData("CameraMatrix", _headMatrix);
	VRDisplayNode::render(renderState, renderHandler);

	renderState->popState();
}